

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrsubstructCondense.cpp
# Opt level: O0

void __thiscall
TPZDohrSubstructCondense<double>::TPZDohrSubstructCondense(TPZDohrSubstructCondense<double> *this)

{
  TPZSavable *in_RDI;
  TPZAutoPointer<TPZMatRed<double,_TPZFMatrix<double>_>_> *in_stack_ffffffffffffffa0;
  TPZSavable *this_00;
  int64_t in_stack_ffffffffffffffa8;
  TPZManVector<double,_10> *in_stack_ffffffffffffffb0;
  TPZFMatrix<double> *in_stack_ffffffffffffffc0;
  TPZFMatrix<double> *this_01;
  
  TPZSavable::TPZSavable(in_RDI,&PTR_PTR_025a7ec8);
  in_RDI->_vptr_TPZSavable = (_func_int **)&PTR__TPZDohrSubstructCondense_025a7e78;
  TPZAutoPointer<TPZMatRed<double,_TPZFMatrix<double>_>_>::TPZAutoPointer(in_stack_ffffffffffffffa0)
  ;
  *(undefined4 *)&in_RDI[2]._vptr_TPZSavable = 0xffffffff;
  *(undefined4 *)((long)&in_RDI[2]._vptr_TPZSavable + 4) = 0xffffffff;
  *(undefined4 *)&in_RDI[3]._vptr_TPZSavable = 0xffffffff;
  TPZVec<int>::TPZVec((TPZVec<int> *)(in_RDI + 4));
  TPZFMatrix<double>::TPZFMatrix(in_stack_ffffffffffffffc0);
  this_01 = (TPZFMatrix<double> *)(in_RDI + 0x1a);
  TPZFMatrix<double>::TPZFMatrix(this_01);
  TPZManVector<double,_10>::TPZManVector(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  TPZFMatrix<double>::TPZFMatrix(this_01);
  this_00 = in_RDI + 0x4c;
  std::
  map<std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>,_std::less<std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>_>,_std::allocator<std::pair<const_std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>_>_>_>
  ::map((map<std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>,_std::less<std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>_>,_std::allocator<std::pair<const_std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>_>_>_>
         *)0x1fa7d47);
  *(undefined1 *)&in_RDI[0x52]._vptr_TPZSavable = 0;
  TPZAutoPointer<TPZMatRed<double,_TPZFMatrix<double>_>_>::TPZAutoPointer
            ((TPZAutoPointer<TPZMatRed<double,_TPZFMatrix<double>_>_> *)this_00);
  TPZFMatrix<double>::TPZFMatrix(this_01);
  TPZFMatrix<double>::TPZFMatrix(this_01);
  TPZFMatrix<double>::TPZFMatrix(this_01);
  return;
}

Assistant:

TPZDohrSubstructCondense<TVar>::TPZDohrSubstructCondense() : fNEquations(-1), fNumInternalEquations(-1), fNumExternalEquations(-1), wasRealloc(false)
{
	//Inicializacao
}